

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

void ddFixLimits(DdManager *unique)

{
  uint local_14;
  DdManager *unique_local;
  
  unique->minDead = (uint)(long)(unique->gcFrac * (double)unique->slots);
  if (unique->slots << 2 < unique->maxCacheHard) {
    local_14 = unique->slots << 2;
  }
  else {
    local_14 = unique->maxCacheHard;
  }
  unique->cacheSlack = local_14 + unique->cacheSlots * -2;
  if ((unique->cacheSlots < unique->slots >> 1) && (-1 < unique->cacheSlack)) {
    cuddCacheResize(unique);
  }
  return;
}

Assistant:

DD_INLINE
static void
ddFixLimits(
  DdManager *unique)
{
    unique->minDead = (unsigned) (unique->gcFrac * (double) unique->slots);
    unique->cacheSlack = (int) ddMin(unique->maxCacheHard,
        DD_MAX_CACHE_TO_SLOTS_RATIO * unique->slots) -
        2 * (int) unique->cacheSlots;
    if (unique->cacheSlots < unique->slots/2 && unique->cacheSlack >= 0)
        cuddCacheResize(unique);
    return;

}